

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mstring.c
# Opt level: O2

uint strnshash(char *s)

{
  char cVar1;
  ushort **ppuVar2;
  uint h;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    cVar1 = *s;
    if ((long)cVar1 == 0) break;
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
      uVar3 = uVar3 * 0x1f + (int)cVar1;
    }
    s = s + 1;
  }
  return uVar3;
}

Assistant:

unsigned int strnshash(const char *s)
{
unsigned int	h = 0;

    while (*s) {
	if (!isspace(*s))
	    h = (h<<5) - h + *s;
	s++; }
    return h;
}